

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenInitializer.cxx
# Opt level: O2

string * __thiscall
cmQtAutoGenInitializer::InfoWriter::
ListJoin<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
          (string *__return_storage_ptr__,InfoWriter *this,
          __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          it_begin,__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   it_end)

{
  char cVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  char *pcVar3;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  pbVar2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this;
LAB_002e4975:
  if (pbVar2 == it_begin._M_current) {
    return __return_storage_ptr__;
  }
  if (pbVar2 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this) {
    std::__cxx11::string::push_back((char)__return_storage_ptr__);
  }
  pcVar3 = (pbVar2->_M_dataplus)._M_p;
  do {
    cVar1 = *pcVar3;
    if ((((cVar1 == '\"') || (cVar1 == '$')) || (cVar1 == ';')) || (cVar1 == '\\')) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    else {
      if (cVar1 == '\0') break;
      std::__cxx11::string::push_back((char)__return_storage_ptr__);
    }
    pcVar3 = pcVar3 + 1;
  } while( true );
  pbVar2 = pbVar2 + 1;
  goto LAB_002e4975;
}

Assistant:

std::string cmQtAutoGenInitializer::InfoWriter::ListJoin(IT it_begin,
                                                         IT it_end)
{
  std::string res;
  for (IT it = it_begin; it != it_end; ++it) {
    if (it != it_begin) {
      res += ';';
    }
    for (const char* c = it->c_str(); *c; ++c) {
      if (*c == '"') {
        // Escape the double quote to avoid ending the argument.
        res += "\\\"";
      } else if (*c == '$') {
        // Escape the dollar to avoid expanding variables.
        res += "\\$";
      } else if (*c == '\\') {
        // Escape the backslash to avoid other escapes.
        res += "\\\\";
      } else if (*c == ';') {
        // Escape the semicolon to avoid list expansion.
        res += "\\;";
      } else {
        // Other characters will be parsed correctly.
        res += *c;
      }
    }
  }
  return res;
}